

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

size_t ByteStreamToBase64(uint8_t *InBuffer,size_t InCount,char *OutBuffer,size_t len)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uchar *puVar8;
  size_t outCount;
  int m;
  int n;
  int i;
  uchar acc_2;
  uchar acc_1;
  uchar *pd;
  uchar *ps;
  size_t len_local;
  char *OutBuffer_local;
  size_t InCount_local;
  uint8_t *InBuffer_local;
  size_t local_8;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = InCount;
  iVar4 = SUB164(auVar3 / ZEXT816(3),0);
  iVar5 = (int)(InCount % 3);
  if (iVar5 == 0) {
    iVar6 = iVar4 << 2;
  }
  else {
    iVar6 = (iVar4 + 1) * 4;
  }
  outCount = (size_t)iVar6;
  if (len < outCount) {
    local_8 = 0;
  }
  else {
    pd = (uchar *)OutBuffer;
    ps = InBuffer;
    for (i = 0; i < iVar4; i = i + 1) {
      bVar1 = *ps;
      *pd = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
            [(byte)((int)(uint)bVar1 >> 2)];
      pbVar7 = ps + 2;
      bVar2 = ps[1];
      pd[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
              [(byte)((bVar1 & 3) << 4 | (byte)((int)(uint)bVar2 >> 4))];
      ps = ps + 3;
      bVar1 = *pbVar7;
      puVar8 = pd + 3;
      pd[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
              [(byte)((bVar2 & 0xf) << 2 | (byte)((int)(uint)bVar1 >> 6))];
      pd = pd + 4;
      *puVar8 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"[bVar1 & 0x3f];
    }
    if (iVar5 == 1) {
      bVar1 = *ps;
      *pd = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
            [(byte)((int)(uint)bVar1 >> 2)];
      pd[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
              [(byte)((bVar1 & 3) << 4)];
      pd[2] = P64;
      pd[3] = P64;
    }
    else if (iVar5 == 2) {
      bVar1 = *ps;
      *pd = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
            [(byte)((int)(uint)bVar1 >> 2)];
      bVar2 = ps[1];
      pd[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
              [(byte)((bVar1 & 3) << 4 | (byte)((int)(uint)bVar2 >> 4))];
      pd[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-~"
              [(byte)((bVar2 & 0xf) << 2)];
      pd[3] = P64;
    }
    local_8 = outCount;
  }
  return local_8;
}

Assistant:

size_t                                /* Number of bytes in the encoded buffer */
	ByteStreamToBase64 (
		    const uint8_t * InBuffer,           /* Input buffer, binary data */
		    size_t    InCount,              /* Number of bytes in the input buffer */
		    char  * OutBuffer,          /* output buffer */
		size_t len			   /* length of output buffer */
	)

	{
		unsigned char * ps;
		unsigned char * pd;
		unsigned char   acc_1;
		unsigned char   acc_2;
		int             i;
		int             n;
		int             m;
		size_t outCount;

		ps = (unsigned char *)InBuffer;
		n = InCount/3;
		m = InCount%3;
		if (!m)
		     outCount = 4*n;
		else
		     outCount = 4*(n+1);
		if (outCount > len) return 0;
		pd = (unsigned char *)OutBuffer;
		for ( i = 0; i<n; i++ ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x30;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;
		     acc_2 = *ps++;
		     acc_1 |= acc_2>>6;        /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     acc_2 &= 0x3f;            /* base64 digit #4 */
		     *pd++ = T64[acc_2];
		}
		if ( m == 1 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;  /* base64 digit #2 */
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     *pd++ = T64[acc_2];
		     *pd++ = P64;
		     *pd++ = P64;

		}
		else if ( m == 2 ){
		     acc_1 = *ps++;
		     acc_2 = (acc_1<<4)&0x3f;
		     acc_1 >>= 2;              /* base64 digit #1 */
		     *pd++ = T64[acc_1];
		     acc_1 = *ps++;
		     acc_2 |= acc_1 >> 4;      /* base64 digit #2 */
		     *pd++ = T64[acc_2];
		     acc_1 &= 0x0f;
		     acc_1 <<=2;               /* base64 digit #3 */
		     *pd++ = T64[acc_1];
		     *pd++ = P64;
		}

		return outCount;
	}